

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_assert.hpp
# Opt level: O0

void debug_assert::default_handler::handle(source_location *loc,char *expression,char *message)

{
  char *message_local;
  char *expression_local;
  source_location *loc_local;
  
  if (*expression == '\0') {
    if (message == (char *)0x0) {
      fprintf(_stderr,"[debug assert] %s:%u: Unreachable code reached.\n",loc->file_name,
              (ulong)loc->line_number);
    }
    else {
      fprintf(_stderr,"[debug assert] %s:%u: Unreachable code reached - %s.\n",loc->file_name,
              (ulong)loc->line_number,message);
    }
  }
  else if (message == (char *)0x0) {
    fprintf(_stderr,"[debug assert] %s:%u: Assertion \'%s\' failed.\n",loc->file_name,
            (ulong)loc->line_number,expression);
  }
  else {
    fprintf(_stderr,"[debug assert] %s:%u: Assertion \'%s\' failed - %s.\n",loc->file_name,
            (ulong)loc->line_number,expression,message);
  }
  return;
}

Assistant:

static void handle(const source_location& loc, const char* expression,
                       const char* message = nullptr) noexcept
    {
#ifndef DEBUG_ASSERT_NO_STDIO
        if (*expression == '\0')
        {
            if (message)
                std::fprintf(stderr, "[debug assert] %s:%u: Unreachable code reached - %s.\n",
                             loc.file_name, loc.line_number, message);
            else
                std::fprintf(stderr, "[debug assert] %s:%u: Unreachable code reached.\n",
                             loc.file_name, loc.line_number);
        }
        else if (message)
            std::fprintf(stderr, "[debug assert] %s:%u: Assertion '%s' failed - %s.\n",
                         loc.file_name, loc.line_number, expression, message);
        else
            std::fprintf(stderr, "[debug assert] %s:%u: Assertion '%s' failed.\n", loc.file_name,
                         loc.line_number, expression);
#else
        (void)loc;
        (void)expression;
        (void)message;
#endif
    }